

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O3

void __thiscall ccs::Node::activate(Node *this,Specificity *spec,SearchState *searchState)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  
  bVar1 = Key::addAll(&searchState->key,&this->constraints);
  searchState->constraintsChanged = (bool)(searchState->constraintsChanged | bVar1);
  bVar1 = SearchState::add(searchState,*spec,this);
  if (bVar1) {
    for (p_Var2 = (this->props)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->props)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      SearchState::cacheProperty(searchState,(string *)(p_Var2 + 1),*spec,(Property *)(p_Var2 + 2));
    }
    for (p_Var2 = (this->andTallies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->andTallies_)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      (**(code **)(**(long **)(p_Var2 + 1) + 0x10))(*(long **)(p_Var2 + 1),this,spec,searchState);
    }
    for (p_Var2 = (this->orTallies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->orTallies_)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      (**(code **)(**(long **)(p_Var2 + 1) + 0x10))(*(long **)(p_Var2 + 1),this,spec,searchState);
    }
  }
  return;
}

Assistant:

void activate(const Specificity &spec, SearchState &searchState) const {
    searchState.constrain(constraints);
    if (searchState.add(spec, this)) {
      for (auto it = props.begin(); it != props.end(); ++it)
        searchState.cacheProperty(it->first, spec, &it->second);
      for (auto it = andTallies_.begin(); it != andTallies_.end(); ++it)
        (*it)->activate(*this, spec, searchState);
      for (auto it = orTallies_.begin(); it != orTallies_.end(); ++it)
        (*it)->activate(*this, spec, searchState);
    }
  }